

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mum.cc
# Opt level: O0

void mum_hash_test(void *key,int len,uint32_t seed,void *out)

{
  uint64_t uVar1;
  uint64_t *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  
  uVar1 = mum_hash((void *)CONCAT44(in_ESI,in_EDX),(size_t)in_RCX,0x1f40ea);
  *in_RCX = uVar1;
  return;
}

Assistant:

void mum_hash_test(const void *key, int len, uint32_t seed, void *out) {
  *(uint64_t *)out = mum_hash(key, len, seed);
}